

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregates.cpp
# Opt level: O0

int __thiscall pbrt::BVHAggregate::flattenBVH(BVHAggregate *this,BVHBuildNode *node,int *offset)

{
  float fVar1;
  undefined4 uVar2;
  int iVar3;
  int *offset_00;
  BVHBuildNode *in_RDX;
  char *unaff_RBX;
  BVHAggregate *in_RSI;
  char (*in_RDI) [18];
  LogLevel unaff_retaddr;
  char *in_stack_00000008;
  LogLevel in_stack_00000014;
  char (*in_stack_00000020) [18];
  int *in_stack_00000028;
  char (*in_stack_00000030) [6];
  int vb;
  int va;
  int nodeOffset;
  LinearBVHNode *linearNode;
  
  offset_00 = (int *)(*(long *)(in_RDI[2] + 4) +
                     (long)(int)(in_RDX->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x * 0x20);
  uVar2 = *(undefined4 *)&in_RSI->field_0x4;
  offset_00[0] = in_RSI->maxPrimsInNode;
  offset_00[1] = uVar2;
  *(pointer *)(offset_00 + 2) =
       (in_RSI->primitives).super__Vector_base<pbrt::Primitive,_std::allocator<pbrt::Primitive>_>.
       _M_impl.super__Vector_impl_data._M_start;
  *(pointer *)(offset_00 + 4) =
       (in_RSI->primitives).super__Vector_base<pbrt::Primitive,_std::allocator<pbrt::Primitive>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  fVar1 = (in_RDX->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x;
  (in_RDX->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x = (float)((int)fVar1 + 1);
  if (in_RSI[1].maxPrimsInNode < 1) {
    *(char *)((long)offset_00 + 0x1e) = (char)*(undefined4 *)&in_RSI->nodes;
    *(undefined2 *)(offset_00 + 7) = 0;
    flattenBVH(in_RSI,in_RDX,offset_00);
    iVar3 = flattenBVH(in_RSI,in_RDX,offset_00);
    offset_00[6] = iVar3;
  }
  else {
    if (((in_RSI->primitives).super__Vector_base<pbrt::Primitive,_std::allocator<pbrt::Primitive>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) ||
       (*(long *)&in_RSI->splitMethod != 0)) {
      LogFatal<char_const(&)[41]>
                (unaff_retaddr,unaff_RBX,(int)((ulong)in_RDI >> 0x20),(char *)in_RSI,
                 (char (*) [41])in_RDX);
    }
    if (0xffff < in_RSI[1].maxPrimsInNode) {
      LogFatal<char_const(&)[18],char_const(&)[6],char_const(&)[18],int&,char_const(&)[6],int&>
                (in_stack_00000014,in_stack_00000008,unaff_retaddr,unaff_RBX,in_RDI,
                 (char (*) [6])in_RSI,in_stack_00000020,in_stack_00000028,in_stack_00000030,_va);
    }
    offset_00[6] = *(int *)((long)&in_RSI->nodes + 4);
    *(short *)(offset_00 + 7) = (short)in_RSI[1].maxPrimsInNode;
  }
  return (int)fVar1;
}

Assistant:

int BVHAggregate::flattenBVH(BVHBuildNode *node, int *offset) {
    LinearBVHNode *linearNode = &nodes[*offset];
    linearNode->bounds = node->bounds;
    int nodeOffset = (*offset)++;
    if (node->nPrimitives > 0) {
        CHECK(!node->children[0] && !node->children[1]);
        CHECK_LT(node->nPrimitives, 65536);
        linearNode->primitivesOffset = node->firstPrimOffset;
        linearNode->nPrimitives = node->nPrimitives;
    } else {
        // Create interior flattened BVH node
        linearNode->axis = node->splitAxis;
        linearNode->nPrimitives = 0;
        flattenBVH(node->children[0], offset);
        linearNode->secondChildOffset = flattenBVH(node->children[1], offset);
    }
    return nodeOffset;
}